

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  BuildSystemImpl *pBVar1;
  StringRef path;
  TaskInterface in_stack_ffffffffffffff88;
  string local_50 [32];
  
  path.Length = (BuildKey *)unescapedWord.Data;
  if (*(int *)((long)this + 0x34) != 0) {
    return;
  }
  path.Data = (char *)unescapedWord.Length;
  llbuild::buildsystem::BuildKey::makeNode((BuildKey *)&stack0xffffffffffffff90,path.Length,path);
  std::__cxx11::string::string(local_50,(string *)&stack0xffffffffffffff90);
  llbuild::core::TaskInterface::discoveredDependency
            ((TaskInterface *)((long)this + 8),(KeyType *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pBVar1 = anon_unknown.dwarf_1352d2::getBuildSystem(in_stack_ffffffffffffff88);
  (*pBVar1->delegate->_vptr_BuildSystemDelegate[0xf])
            (pBVar1->delegate,*(undefined8 *)((long)this + 0x28),path.Length,
             (char *)unescapedWord.Length,0);
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        // Only process dependencies for the first rule (the output file), the
        // rest are identical.
        if (ruleNumber == 0) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          getBuildSystem(ti).getDelegate().commandFoundDiscoveredDependency(command, unescapedWord,
                                                                            DiscoveredDependencyKind::Input);
        }
      }